

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-output.c
# Opt level: O1

_Bool panel_should_modify(term_conflict *t,wchar_t wy,wchar_t wx)

{
  wchar_t wVar1;
  wchar_t wVar2;
  _Bool _Var3;
  
  if ((term_conflict *)angband_term[0] == t) {
    wVar2 = Term->hgt - (row_top_map[Term->sidebar_mode] + row_bottom_map[Term->sidebar_mode]);
  }
  else {
    wVar2 = t->hgt;
  }
  if ((term_conflict *)angband_term[0] == t) {
    wVar1 = ~col_map[Term->sidebar_mode] + Term->wid;
  }
  else {
    wVar1 = t->wid;
  }
  wVar2 = cave->height - wVar2 / (int)(uint)tile_height;
  if (wy <= wVar2) {
    wVar2 = wy;
  }
  if (wVar2 < L'\x01') {
    wVar2 = L'\0';
  }
  _Var3 = true;
  if (t->offset_y == wVar2) {
    wVar2 = cave->width - wVar1 / (int)(uint)tile_width;
    if (wx <= wVar2) {
      wVar2 = wx;
    }
    wVar1 = L'\0';
    if (L'\0' < wVar2) {
      wVar1 = wVar2;
    }
    _Var3 = t->offset_x != wVar1;
  }
  return _Var3;
}

Assistant:

bool panel_should_modify(term *t, int wy, int wx)
{
	int dungeon_hgt = cave->height;
	int dungeon_wid = cave->width;
	int screen_hgt = (t == angband_term[0]) ?
		SCREEN_HGT : t->hgt / tile_height;
	int screen_wid = (t == angband_term[0]) ?
		SCREEN_WID : t->wid / tile_width;

	/* Verify wy, adjust if needed */
	if (wy > dungeon_hgt - screen_hgt) wy = dungeon_hgt - screen_hgt;
	if (wy < 0) wy = 0;

	/* Verify wx, adjust if needed */
	if (wx > dungeon_wid - screen_wid) wx = dungeon_wid - screen_wid;
	if (wx < 0) wx = 0;

	/* Needs changes? */
	return ((t->offset_y != wy) || (t->offset_x != wx));
}